

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::AddAlreadyReserved(RepeatedField<unsigned_int> *this)

{
  int iVar1;
  uint *puVar2;
  int *in_RDI;
  RepeatedField<unsigned_int> *in_stack_fffffffffffffff0;
  
  puVar2 = elements(in_stack_fffffffffffffff0);
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  return puVar2 + iVar1;
}

Assistant:

inline Element* RepeatedField<Element>::AddAlreadyReserved() {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  return &elements()[current_size_++];
}